

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

XmlWriter * __thiscall Catch::XmlWriter::operator=(XmlWriter *this,XmlWriter *other)

{
  pointer pcVar1;
  XmlWriter temp;
  undefined1 local_60 [32];
  _Alloc_hider local_40;
  char local_30 [16];
  ostream *local_20;
  
  local_60[0] = other->m_tagIsOpen;
  local_60[1] = other->m_needsNewline;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_60 + 8),&other->m_tags);
  local_40._M_p = local_30;
  pcVar1 = (other->m_indent)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (other->m_indent)._M_string_length);
  local_20 = other->m_os;
  swap(this,(XmlWriter *)local_60);
  ~XmlWriter((XmlWriter *)local_60);
  return this;
}

Assistant:

XmlWriter& operator = ( XmlWriter const& other ) {
            XmlWriter temp( other );
            swap( temp );
            return *this;
        }